

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::basic_string<char,std::char_traits<char>,google::libc_allocator_with_realloc<char>>,void>
               (basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>
                *container,ostream *os)

{
  bool bVar1;
  ostream *in_RSI;
  undefined8 in_RDI;
  char *elem;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_> *__range3;
  size_t count;
  size_t kMaxCount;
  basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>_>
  *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>_>
  local_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  ostream *local_10;
  undefined8 local_8;
  
  local_18 = 0x20;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RSI,'{');
  local_20 = 0;
  local_28 = local_8;
  local_30._M_current =
       (char *)std::__cxx11::
               basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>
               ::begin(in_stack_ffffffffffffffb8);
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>::end
            (in_stack_ffffffffffffffc8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
LAB_010bae0a:
      if (local_20 != 0) {
        std::operator<<(local_10,' ');
      }
      std::operator<<(local_10,'}');
      return;
    }
    in_stack_ffffffffffffffc0 =
         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>_>
          *)__gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>_>
            ::operator*(&local_30);
    if ((local_20 != 0) && (std::operator<<(local_10,','), local_20 == 0x20)) {
      std::operator<<(local_10," ...");
      goto LAB_010bae0a;
    }
    std::operator<<(local_10,' ');
    UniversalPrint<char>((char *)in_stack_ffffffffffffffc0,(ostream *)in_stack_ffffffffffffffb8);
    local_20 = local_20 + 1;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_google::libc_allocator_with_realloc<char>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }